

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::
SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>,_8UL>
::clear(SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>,_8UL>
        *this)

{
  unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
  *puVar1;
  _Tuple_impl<0UL,_diligent_spirv_cross::SPIRExpression_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
  __ptr;
  ulong uVar2;
  
  if ((this->
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
      ).buffer_size != 0) {
    uVar2 = 0;
    do {
      puVar1 = (this->
               super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
               ).ptr;
      __ptr.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl =
           puVar1[uVar2]._M_t.
           super___uniq_ptr_impl<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRExpression_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
           .super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>;
      if (__ptr.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl !=
          (SPIRExpression *)0x0) {
        free((void *)__ptr.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>.
                     _M_head_impl);
      }
      puVar1[uVar2]._M_t.
      super___uniq_ptr_impl<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRExpression_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
      .super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false> =
           (_Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>)0x0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->
                     super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
                     ).buffer_size);
  }
  (this->
  super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
  ).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}